

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyDescriptor.cpp
# Opt level: O2

void __thiscall
Js::PropertyDescriptor::MergeFrom(PropertyDescriptor *this,PropertyDescriptor *descriptor)

{
  if (descriptor->configurableSpecified == true) {
    this->Configurable = descriptor->Configurable;
    this->configurableSpecified = true;
  }
  if (descriptor->enumerableSpecified == true) {
    this->Enumerable = descriptor->Enumerable;
    this->enumerableSpecified = true;
  }
  if (descriptor->writableSpecified == true) {
    this->Writable = descriptor->Writable;
    this->writableSpecified = true;
  }
  if (descriptor->valueSpecified == true) {
    SetValue(this,(descriptor->Value).ptr);
  }
  if (descriptor->getterSpecified == true) {
    SetGetter(this,(descriptor->Getter).ptr);
  }
  if (descriptor->setterSpecified == true) {
    SetSetter(this,(descriptor->Setter).ptr);
    return;
  }
  return;
}

Assistant:

void PropertyDescriptor::MergeFrom(const PropertyDescriptor& descriptor)
    {
        if (descriptor.configurableSpecified)
        {
            this->SetConfigurable(descriptor.Configurable);
        }
        if (descriptor.enumerableSpecified)
        {
            this->SetEnumerable(descriptor.Enumerable);
        }
        if (descriptor.writableSpecified)
        {
            this->SetWritable(descriptor.Writable);
        }

        if (descriptor.valueSpecified)
        {
            this->SetValue(descriptor.Value);
        }
        if (descriptor.getterSpecified)
        {
            this->SetGetter(descriptor.Getter);
        }
        if (descriptor.setterSpecified)
        {
            this->SetSetter(descriptor.Setter);
        }
    }